

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void pager_page_to_dirty_list(Pager *pPager,Page *pPage)

{
  Page *pPVar1;
  
  if ((pPage->flags & 2U) == 0) {
    pPage->flags = pPage->flags | 0x26;
    pPage->pDirtyPrev = (Page *)0x0;
    pPVar1 = pPager->pDirty;
    pPage->pDirtyNext = pPVar1;
    if (pPVar1 != (Page *)0x0) {
      pPVar1->pDirtyPrev = pPage;
    }
    pPager->pDirty = pPage;
    if (pPager->pFirstDirty == (Page *)0x0) {
      pPager->pFirstDirty = pPage;
      return;
    }
  }
  return;
}

Assistant:

static void pager_page_to_dirty_list(Pager *pPager,Page *pPage)
{
	if( pPage->flags & PAGE_DIRTY ){
		/* Already set */
		return;
	}
	/* Mark the page as dirty */
	pPage->flags |= PAGE_DIRTY|PAGE_NEED_SYNC|PAGE_IN_JOURNAL;
	/* Link to the list */
	pPage->pDirtyPrev = 0;
	pPage->pDirtyNext = pPager->pDirty;
	if( pPager->pDirty ){
		pPager->pDirty->pDirtyPrev = pPage;
	}
	pPager->pDirty = pPage;
	if( pPager->pFirstDirty == 0 ){
		pPager->pFirstDirty = pPage;
	}
}